

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

void absl::lts_20250127::str_format_internal::anon_unknown_0::FinalPrint
               (FormatState *state,string_view data,size_t padding_offset,size_t trailing_zeros,
               string_view data_postfix)

{
  char c;
  Flags FVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t n;
  size_t n_00;
  string_view v;
  string_view v_00;
  
  v._M_str = data._M_str;
  uVar3 = data._M_len;
  uVar5 = (ulong)state->conv->width_;
  c = state->sign_char;
  if ((long)uVar5 < 0) {
    if (c != '\0') {
      FormatSinkImpl::Append(state->sink,1,c);
    }
    FormatSinkImpl::Append(state->sink,data);
    FormatSinkImpl::Append(state->sink,trailing_zeros,'0');
    FormatSinkImpl::Append(state->sink,data_postfix);
    return;
  }
  uVar2 = (trailing_zeros + uVar3 + data_postfix._M_len + 1) - (ulong)(c == '\0');
  n = uVar5 - uVar2;
  if (uVar5 < uVar2 || n == 0) {
    sVar4 = 0;
    n_00 = 0;
  }
  else {
    FVar1 = state->conv->flags_;
    if ((FVar1 & kLeft) != kBasic) {
      sVar4 = 0;
      n_00 = 0;
      goto LAB_00388f40;
    }
    sVar4 = 0;
    n_00 = n;
    if ((FVar1 & kZero) == kBasic) {
      sVar4 = n;
      n_00 = 0;
    }
  }
  n = 0;
LAB_00388f40:
  FormatSinkImpl::Append(state->sink,sVar4,' ');
  if (state->sign_char != '\0') {
    FormatSinkImpl::Append(state->sink,1,state->sign_char);
  }
  sVar4 = padding_offset;
  if (uVar3 < padding_offset) {
    sVar4 = uVar3;
  }
  v._M_len = sVar4;
  FormatSinkImpl::Append(state->sink,v);
  FormatSinkImpl::Append(state->sink,n_00,'0');
  v_00._M_len = uVar3 - padding_offset;
  if (padding_offset <= uVar3) {
    v_00._M_str = v._M_str + padding_offset;
    FormatSinkImpl::Append(state->sink,v_00);
    FormatSinkImpl::Append(state->sink,trailing_zeros,'0');
    FormatSinkImpl::Append(state->sink,data_postfix);
    FormatSinkImpl::Append(state->sink,n,' ');
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
             padding_offset,uVar3);
}

Assistant:

void FinalPrint(const FormatState& state,
                absl::string_view data,
                size_t padding_offset,
                size_t trailing_zeros,
                absl::string_view data_postfix) {
  if (state.conv.width() < 0) {
    // No width specified. Fast-path.
    if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
    state.sink->Append(data);
    state.sink->Append(trailing_zeros, '0');
    state.sink->Append(data_postfix);
    return;
  }

  auto padding =
      ExtraWidthToPadding((state.sign_char != '\0' ? 1 : 0) + data.size() +
                              data_postfix.size() + trailing_zeros,
                          state);

  state.sink->Append(padding.left_spaces, ' ');
  if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
  // Padding in general needs to be inserted somewhere in the middle of `data`.
  state.sink->Append(data.substr(0, padding_offset));
  state.sink->Append(padding.zeros, '0');
  state.sink->Append(data.substr(padding_offset));
  state.sink->Append(trailing_zeros, '0');
  state.sink->Append(data_postfix);
  state.sink->Append(padding.right_spaces, ' ');
}